

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetTxOutCommitmentTest_Test::TestBody
          (ConfidentialTransaction_SetTxOutCommitmentTest_Test *this)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  Amount extraout_DL;
  AssertHelper local_820;
  Message local_818;
  string local_810 [32];
  ByteData local_7f0;
  string local_7d8 [32];
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_8;
  Message local_7a0;
  string local_798 [32];
  ByteData local_778;
  string local_760 [32];
  undefined1 local_740 [8];
  AssertionResult gtest_ar_7;
  Message local_728;
  ConfidentialNonce local_720;
  string local_6f8 [32];
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_6;
  Message local_6c0;
  string local_6b8 [32];
  Script local_698;
  string local_660 [32];
  undefined1 local_640 [8];
  AssertionResult gtest_ar_5;
  Message local_628;
  ConfidentialValue local_620;
  string local_5f8 [32];
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_4;
  Message local_5c0;
  ConfidentialAssetId local_5b8;
  string local_590 [32];
  undefined1 local_570 [8];
  AssertionResult gtest_ar_3;
  Message local_558;
  ConfidentialTxOutReference local_550;
  AssertHelper local_458;
  Message local_450;
  ConfidentialNonce local_448;
  allocator local_419;
  string local_418 [32];
  undefined1 local_3f8 [8];
  ByteData range_proof;
  string local_3d8 [32];
  undefined1 local_3b8 [8];
  ByteData surjection_proof;
  string local_398 [32];
  undefined1 local_378 [8];
  ConfidentialNonce nonce;
  Message local_348;
  ConfidentialTxOutReference local_340;
  AssertHelper local_248;
  Message local_240;
  int local_238;
  uint local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_2;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  Message local_1f0;
  undefined1 local_1e8 [8];
  ConfidentialTxOutReference txout_ref;
  ConfidentialAssetId asset;
  undefined1 local_b8 [8];
  Amount amt;
  int64_t exp_satoshi;
  Message local_98;
  int local_90;
  uint local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Message local_70 [3];
  uint local_54;
  undefined1 local_50 [4];
  uint32_t index;
  ConfidentialTransaction tx;
  ConfidentialTransaction_SetTxOutCommitmentTest_Test *this_local;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,(string *)&exp_tx_empty_hex_abi_cxx11_);
  local_54 = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxIn
                           ((Txid *)local_50,0x67c088,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ff,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_70);
  }
  local_8c = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_90 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_88,"tx.GetTxOutCount()","0",&local_8c,&local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&exp_satoshi,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x302,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&exp_satoshi,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&exp_satoshi);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_b8 = (undefined1  [8])cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  amt = extraout_DL;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)
             &txout_ref.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_1e8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxOut
                           ((Amount *)local_50,(ConfidentialAssetId *)local_b8,
                            (Script *)
                            &txout_ref.range_proof_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    testing::Message::Message(&local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x308,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f0);
  }
  local_20c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_208,"index","0",&local_54,&local_20c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_234 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_238 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_230,"tx.GetTxOutCount()","1",&local_234,&local_238);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x30a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&local_340);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_1e8,&local_340);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_340);
    }
  }
  else {
    testing::Message::Message(&local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nonce.version_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x30b,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&nonce.version_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nonce.version_);
    testing::Message::~Message(&local_348);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_398,"991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             (allocator *)
             ((long)&surjection_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_378,local_398);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&surjection_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3d8,"1234567890",
             (allocator *)
             ((long)&range_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_3b8,local_3d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&range_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"1234567890123456789012345678901234567890",&local_419);
  cfd::core::ByteData::ByteData((ByteData *)local_3f8,local_418);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    uVar1 = local_54;
    if (bVar2) {
      cfd::core::ConfidentialTxOutReference::GetConfidentialValue
                ((ConfidentialValue *)&local_448,(ConfidentialTxOutReference *)local_1e8);
      cfd::core::ConfidentialTransaction::SetTxOutCommitment
                ((uint)local_50,(ConfidentialAssetId *)(ulong)uVar1,
                 (ConfidentialValue *)
                 &txout_ref.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_448,(ByteData *)local_378,
                 (ByteData *)local_3b8);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_448);
    }
  }
  else {
    testing::Message::Message(&local_450);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x314,
               "Expected: (tx.SetTxOutCommitment(index, asset, txout_ref.GetConfidentialValue(), nonce, surjection_proof, range_proof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message(&local_450);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)&local_550);
      cfd::core::ConfidentialTxOutReference::operator=
                ((ConfidentialTxOutReference *)local_1e8,&local_550);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_550);
    }
  }
  else {
    testing::Message::Message(&local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x315,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_558);
  }
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_5b8,(ConfidentialTxOutReference *)local_1e8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_570,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar3,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_590);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_5b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar2) {
    testing::Message::Message(&local_5c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x318,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_620,(ConfidentialTxOutReference *)local_1e8);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5d8,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",pcVar3,"010000000000bc614e");
  std::__cxx11::string::~string(local_5f8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_620);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar2) {
    testing::Message::Message(&local_628);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x31a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_698,(AbstractTxOutReference *)local_1e8);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_640,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string(local_660);
  cfd::core::Script::~Script(&local_698);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar2) {
    testing::Message::Message(&local_6c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x31c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_720,(ConfidentialTxOutReference *)local_1e8);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6d8,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",pcVar3,
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  std::__cxx11::string::~string(local_6f8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_720);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar2) {
    testing::Message::Message(&local_728);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,799,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_778,(ConfidentialTxOutReference *)local_1e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_740,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string(local_760);
  cfd::core::ByteData::~ByteData(&local_778);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(&local_7a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x321,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_7f0,(ConfidentialTxOutReference *)local_1e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7b8,"txout_ref.GetRangeProof().GetHex().c_str()",
             "range_proof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string(local_810);
  std::__cxx11::string::~string(local_7d8);
  cfd::core::ByteData::~ByteData(&local_7f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b8);
  if (!bVar2) {
    testing::Message::Message(&local_818);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x323,pcVar3);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b8);
  cfd::core::ByteData::~ByteData((ByteData *)local_3f8);
  cfd::core::ByteData::~ByteData((ByteData *)local_3b8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_378);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_1e8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId
            ((ConfidentialAssetId *)
             &txout_ref.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetTxOutCommitmentTest) {
  ConfidentialTransaction tx(exp_tx_empty_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));

  // AddTxOut, GetTxOut, GetTxOutCount
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  int64_t exp_satoshi = 12345678;

  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  ConfidentialTxOutReference txout_ref;
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));

  // SetTxOutCommitment
  ConfidentialNonce nonce(
      "991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  ByteData surjection_proof("1234567890");
  ByteData range_proof("1234567890123456789012345678901234567890");
  EXPECT_NO_THROW(
      (tx.SetTxOutCommitment(index, asset, txout_ref.GetConfidentialValue(),
                             nonce, surjection_proof, range_proof)));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());
}